

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O2

Texture * __thiscall
nesvis::PpuHelper::get_pattern_table_texture
          (Texture *__return_storage_ptr__,PpuHelper *this,uint16_t pos,uint16_t pattern_table,
          uint16_t palette)

{
  uint uVar1;
  int iVar2;
  Color CVar3;
  IMmu *pIVar4;
  uint uVar5;
  uint8_t row;
  uint y;
  uint8_t col;
  uint uVar6;
  Color color;
  int iStack_64;
  Image image;
  
  sf::Image::Image(&image);
  sf::Color::Color(&color,'\n','d','\0',0xff);
  sf::Image::create(&image,8,8,&color);
  for (y = 0; y != 8; y = y + 1) {
    pIVar4 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
    uVar5 = (uint)pos * 0x10 + (uint)pattern_table * 0x1000 | y;
    uVar1 = (*pIVar4->_vptr_IMmu[3])(pIVar4,(ulong)(uVar5 & 0xffff));
    pIVar4 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
    iVar2 = (*pIVar4->_vptr_IMmu[3])(pIVar4,(ulong)(uVar5 & 0xffff | 8));
    uVar6 = 7;
    for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
      CVar3 = get_background_color
                        (this,palette,
                         ((byte)iVar2 >> ((byte)uVar6 & 0x1f)) * '\x02' & 2 |
                         ((uVar1 & 0xff) >> (uVar6 & 0x1f) & 1) != 0);
      color = CVar3;
      sf::Image::setPixel(&image,uVar5,y,&color);
      uVar6 = (uint)(byte)((byte)uVar6 - 1);
    }
  }
  sf::Texture::Texture(__return_storage_ptr__);
  color.r = '\0';
  color.g = '\0';
  color.b = '\0';
  color.a = '\0';
  iStack_64 = 0;
  sf::Texture::loadFromImage(__return_storage_ptr__,&image,(IntRect *)&color);
  sf::Image::~Image(&image);
  return __return_storage_ptr__;
}

Assistant:

sf::Texture PpuHelper::get_pattern_table_texture(uint16_t pos,
        uint16_t pattern_table,
        uint16_t palette) {
    sf::Image image;
    image.create(8, 8, sf::Color(10, 100, 0));

    for (uint8_t row = 0; row < 8; ++row) {
        // Second pattern table starts at 0x1000
        const uint16_t base_address = pattern_table * 0x1000 + pos * 16 + row;
        const uint8_t a = nes_->ppu_mmu().read_byte(base_address);
        const uint8_t b = nes_->ppu_mmu().read_byte(base_address + 8u);

        for (uint8_t col = 0; col < 8u; ++col) {
            // First column is the leftmost bit
            const uint16_t mask = 1u << (7u - col);
            const uint8_t bit_a = !!(a & mask);
            const uint8_t bit_b = !!(b & mask);
            const uint8_t color_index =
                    bit_a | static_cast<uint8_t>(bit_b << 1u);

            const auto color = get_background_color(palette, color_index);
            image.setPixel(col, row, color);
        }
    }
    sf::Texture texture;
    texture.loadFromImage(image);
    return texture;
}